

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O1

void Tim_ManStop(Tim_Man_t *p)

{
  Vec_Ptr_t *__ptr;
  void **__ptr_00;
  long lVar1;
  
  __ptr = p->vDelayTables;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (0 < __ptr->nSize) {
      lVar1 = 0;
      do {
        if ((void *)0x2 < __ptr->pArray[lVar1]) {
          free(__ptr->pArray[lVar1]);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    free(__ptr);
  }
  if (p->vBoxes != (Vec_Ptr_t *)0x0) {
    __ptr_00 = p->vBoxes->pArray;
    if (__ptr_00 != (void **)0x0) {
      free(__ptr_00);
      p->vBoxes->pArray = (void **)0x0;
    }
    if (p->vBoxes != (Vec_Ptr_t *)0x0) {
      free(p->vBoxes);
      p->vBoxes = (Vec_Ptr_t *)0x0;
    }
  }
  Mem_FlexStop(p->pMemObj,0);
  if (p->pCis != (Tim_Obj_t *)0x0) {
    free(p->pCis);
    p->pCis = (Tim_Obj_t *)0x0;
  }
  if (p->pCos != (Tim_Obj_t *)0x0) {
    free(p->pCos);
    p->pCos = (Tim_Obj_t *)0x0;
  }
  free(p);
  return;
}

Assistant:

void Tim_ManStop( Tim_Man_t * p )
{
    Vec_PtrFreeFree( p->vDelayTables );
    Vec_PtrFreeP( &p->vBoxes );
    Mem_FlexStop( p->pMemObj, 0 );
    ABC_FREE( p->pCis );
    ABC_FREE( p->pCos );
    ABC_FREE( p );
}